

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O2

void gai_nb_init(void)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  int *piVar3;
  long lVar4;
  
  nb_max_outstanding = 0x100;
  __nptr = getenv("COMEX_MAX_NB_OUTSTANDING");
  if (__nptr == (char *)0x0) {
    iVar1 = 0x100;
  }
  else {
    nb_max_outstanding = atoi(__nptr);
    iVar1 = nb_max_outstanding;
    if (nb_max_outstanding - 0x101U < 0xffffff00) {
      pnga_error("Illegal number of outstanding Non-block requests specified",
                 (long)nb_max_outstanding);
      iVar1 = nb_max_outstanding;
    }
  }
  piVar2 = &armci_ihdl_array[0].active;
  piVar3 = &ga_ihdl_array[0].active;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    ((ga_nbhdl_array_t *)(piVar3 + -4))->ahandle = (ga_armcihdl_t *)0x0;
    *(undefined8 *)(piVar3 + -2) = 0xffffffff00000000;
    *piVar3 = 0;
    *piVar2 = 0;
    *(struct_armcihdl_t **)(piVar2 + -5) = (struct_armcihdl_t *)0x0;
    *(struct_armcihdl_t **)(piVar2 + -3) = (struct_armcihdl_t *)0x0;
    piVar2 = piVar2 + 8;
    piVar3 = piVar3 + 6;
  }
  return;
}

Assistant:

void gai_nb_init()
{
  int i;
  char *value;
  /* This is a hideous kluge, but some users want to be able to set this
   * externally. The fact that only integer handles are exchanged between GA and
   * the underlying runtime make it very difficult to handle in a more elegant
   * manner. */
  nb_max_outstanding = MAX_NUM_NB_HDLS; /* default */
  value = getenv("COMEX_MAX_NB_OUTSTANDING");
  if (NULL != value) {
    nb_max_outstanding = atoi(value);
  }
  if (nb_max_outstanding <1 || nb_max_outstanding > MAX_NUM_NB_HDLS) {
    pnga_error("Illegal number of outstanding Non-block requests specified",
        nb_max_outstanding);
  }
  for (i=0; i<nb_max_outstanding; i++) {
    ga_ihdl_array[i].ahandle = NULL;
    ga_ihdl_array[i].count = 0;
    ga_ihdl_array[i].active = 0;
    ga_ihdl_array[i].ga_nbtag = -1;
    armci_ihdl_array[i].next = NULL;
    armci_ihdl_array[i].previous = NULL;
    armci_ihdl_array[i].active = 0;
    ARMCI_INIT_HANDLE(&armci_ihdl_array[i].handle);
  }
}